

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CamCal.cpp
# Opt level: O2

void __thiscall CCamCal::outTxt(CCamCal *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 *puVar4;
  long lVar5;
  FILE *__stream;
  double *pdVar6;
  Mat local_100 [8];
  Mat oCalIntMat;
  undefined8 *local_f0;
  long *local_b8;
  Mat local_a0 [8];
  Mat oCalDistCoeffMat;
  
  __stream = fopen((this->m_oCfg).m_acOutCamMatPth,"w");
  puVar4 = *(undefined8 **)&this->field_0x508;
  lVar5 = **(long **)&this->field_0x540;
  fprintf(__stream,
          "Homography matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
          *puVar4,puVar4[1],puVar4[2],*(undefined8 *)((long)puVar4 + lVar5),
          *(undefined8 *)((long)puVar4 + lVar5 + 8),*(undefined8 *)((long)puVar4 + lVar5 + 0x10),
          *(undefined8 *)((long)puVar4 + lVar5 * 2),*(undefined8 *)((long)puVar4 + lVar5 * 2 + 8));
  puVar4 = *(undefined8 **)&this->field_0x508;
  lVar5 = **(long **)&this->field_0x540;
  printf("Homography matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
         *puVar4,puVar4[1],puVar4[2],*(undefined8 *)((long)puVar4 + lVar5),
         *(undefined8 *)((long)puVar4 + lVar5 + 8),*(undefined8 *)((long)puVar4 + lVar5 + 0x10),
         *(undefined8 *)((long)puVar4 + lVar5 * 2),*(undefined8 *)((long)puVar4 + lVar5 * 2 + 8));
  if ((this->m_oCfg).m_bCalDistFlg == true) {
    cv::Mat::Mat(local_100,&(this->m_oCfg).m_oCalIntMat);
    lVar5 = *local_b8;
    fprintf(__stream,
            "Intrinsic parameter matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n"
            ,*local_f0,local_f0[1],local_f0[2],*(undefined8 *)((long)local_f0 + lVar5),
            *(undefined8 *)((long)local_f0 + lVar5 + 8),
            *(undefined8 *)((long)local_f0 + lVar5 + 0x10),
            *(undefined8 *)((long)local_f0 + lVar5 * 2),
            *(undefined8 *)((long)local_f0 + lVar5 * 2 + 8));
    lVar5 = *local_b8;
    printf("Intrinsic parameter matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n"
           ,*local_f0,local_f0[1],local_f0[2],*(undefined8 *)((long)local_f0 + lVar5),
           *(undefined8 *)((long)local_f0 + lVar5 + 8),
           *(undefined8 *)((long)local_f0 + lVar5 + 0x10),
           *(undefined8 *)((long)local_f0 + lVar5 * 2),
           *(undefined8 *)((long)local_f0 + lVar5 * 2 + 8));
    cv::Mat::Mat(local_a0,&(this->m_oCfg).m_oCalDistCoeffMat);
    pdVar6 = cv::Mat::at<double>(local_a0,0);
    dVar1 = *pdVar6;
    pdVar6 = cv::Mat::at<double>(local_a0,1);
    dVar2 = *pdVar6;
    pdVar6 = cv::Mat::at<double>(local_a0,2);
    dVar3 = *pdVar6;
    pdVar6 = cv::Mat::at<double>(local_a0,3);
    fprintf(__stream,"Distortion coefficients: %.15lf %.15lf %.15lf %.15lf\n",dVar1,dVar2,dVar3,
            *pdVar6);
    pdVar6 = cv::Mat::at<double>(local_a0,0);
    dVar1 = *pdVar6;
    pdVar6 = cv::Mat::at<double>(local_a0,1);
    dVar2 = *pdVar6;
    pdVar6 = cv::Mat::at<double>(local_a0,2);
    dVar3 = *pdVar6;
    pdVar6 = cv::Mat::at<double>(local_a0,3);
    printf("Distortion coefficients: %.15lf %.15lf %.15lf %.15lf\n",dVar1,dVar2,dVar3,*pdVar6);
    cv::Mat::~Mat(local_a0);
    cv::Mat::~Mat(local_100);
  }
  fprintf(__stream,"Reprojection error: %.15lf\n",this->m_fReprojErr);
  printf("Reprojection error: %.15lf\n",this->m_fReprojErr);
  fclose(__stream);
  return;
}

Assistant:

void CCamCal::outTxt(void)
{
	FILE* pfHomoMat = std::fopen(m_oCfg.getOutCamMatPth(), "w");

	std::fprintf(pfHomoMat, "Homography matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
		m_oHomoMat.at<double>(0, 0), m_oHomoMat.at<double>(0, 1), m_oHomoMat.at<double>(0, 2),
		m_oHomoMat.at<double>(1, 0), m_oHomoMat.at<double>(1, 1), m_oHomoMat.at<double>(1, 2),
		m_oHomoMat.at<double>(2, 0), m_oHomoMat.at<double>(2, 1), m_oHomoMat.at<double>(2, 2));
	std::printf("Homography matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
		m_oHomoMat.at<double>(0, 0), m_oHomoMat.at<double>(0, 1), m_oHomoMat.at<double>(0, 2),
		m_oHomoMat.at<double>(1, 0), m_oHomoMat.at<double>(1, 1), m_oHomoMat.at<double>(1, 2),
		m_oHomoMat.at<double>(2, 0), m_oHomoMat.at<double>(2, 1), m_oHomoMat.at<double>(2, 2));

	if (m_oCfg.getCalDistFlg())
	{
	    cv::Mat oCalIntMat = m_oCfg.getCalIntMat();
	    std::fprintf(pfHomoMat, "Intrinsic parameter matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
            	oCalIntMat.at<double>(0, 0), oCalIntMat.at<double>(0, 1), oCalIntMat.at<double>(0, 2),
            	oCalIntMat.at<double>(1, 0), oCalIntMat.at<double>(1, 1), oCalIntMat.at<double>(1, 2),
            	oCalIntMat.at<double>(2, 0), oCalIntMat.at<double>(2, 1), oCalIntMat.at<double>(2, 2));
	    std::printf("Intrinsic parameter matrix: %.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf;%.15lf %.15lf %.15lf\n",
            	oCalIntMat.at<double>(0, 0), oCalIntMat.at<double>(0, 1), oCalIntMat.at<double>(0, 2),
            	oCalIntMat.at<double>(1, 0), oCalIntMat.at<double>(1, 1), oCalIntMat.at<double>(1, 2),
            	oCalIntMat.at<double>(2, 0), oCalIntMat.at<double>(2, 1), oCalIntMat.at<double>(2, 2));

		cv::Mat oCalDistCoeffMat = m_oCfg.getCalDistCoeffMat();
		std::fprintf(pfHomoMat, "Distortion coefficients: %.15lf %.15lf %.15lf %.15lf\n",
			oCalDistCoeffMat.at<double>(0), oCalDistCoeffMat.at<double>(1),
			oCalDistCoeffMat.at<double>(2), oCalDistCoeffMat.at<double>(3));
		std::printf("Distortion coefficients: %.15lf %.15lf %.15lf %.15lf\n",
			oCalDistCoeffMat.at<double>(0), oCalDistCoeffMat.at<double>(1),
			oCalDistCoeffMat.at<double>(2), oCalDistCoeffMat.at<double>(3));
	}

	std::fprintf(pfHomoMat, "Reprojection error: %.15lf\n", m_fReprojErr);
	std::printf("Reprojection error: %.15lf\n", m_fReprojErr);

	std::fclose(pfHomoMat);
}